

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_plt(opj_j2k_t *j2k)

{
  uint uVar1;
  long in_RDI;
  opj_cio_t *cio;
  int add;
  int packet_len;
  int Zplt;
  int i;
  int len;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int local_10;
  
  n = (int)((ulong)*(undefined8 *)(in_RDI + 0x70) >> 0x20);
  uVar1 = cio_read((opj_cio_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),n);
  cio_read((opj_cio_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),n);
  for (local_10 = uVar1 - 3; 0 < local_10; local_10 = local_10 + -1) {
    in_stack_ffffffffffffffe4 =
         cio_read((opj_cio_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),n);
  }
  return;
}

Assistant:

static void j2k_read_plt(opj_j2k_t *j2k) {
	int len, i, Zplt, packet_len = 0, add;
	
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);		/* Lplt */
	Zplt = cio_read(cio, 1);	/* Zplt */
	for (i = len - 3; i > 0; i--) {
		add = cio_read(cio, 1);
		packet_len = (packet_len << 7) + add;	/* Iplt_i */
		if ((add & 0x80) == 0) {
			/* New packet */
			packet_len = 0;
		}
	}
}